

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

void Ins_JMPR(TT_ExecContext exc,FT_Long *args)

{
  FT_Error FVar1;
  long lVar2;
  ulong uVar3;
  
  if ((*args == 0) && (exc->args == 0)) {
    FVar1 = 0x84;
  }
  else {
    lVar2 = *args + exc->IP;
    exc->IP = lVar2;
    FVar1 = 0x84;
    if ((-1 < lVar2) &&
       (((long)exc->callTop < 1 || (lVar2 <= (exc->callStack[(long)exc->callTop + -1].Def)->end))))
    {
      exc->step_ins = '\0';
      if (*args < 0) {
        uVar3 = exc->neg_jump_counter + 1;
        exc->neg_jump_counter = uVar3;
        FVar1 = 0x8b;
        if (exc->neg_jump_counter_max < uVar3) goto LAB_00214c1d;
      }
      return;
    }
  }
LAB_00214c1d:
  exc->error = FVar1;
  return;
}

Assistant:

static void
  Ins_JMPR( TT_ExecContext  exc,
            FT_Long*        args )
  {
    if ( args[0] == 0 && exc->args == 0 )
    {
      exc->error = FT_THROW( Bad_Argument );
      return;
    }

    exc->IP = ADD_LONG( exc->IP, args[0] );
    if ( exc->IP < 0                                             ||
         ( exc->callTop > 0                                    &&
           exc->IP > exc->callStack[exc->callTop - 1].Def->end ) )
    {
      exc->error = FT_THROW( Bad_Argument );
      return;
    }

    exc->step_ins = FALSE;

    if ( args[0] < 0 )
    {
      if ( ++exc->neg_jump_counter > exc->neg_jump_counter_max )
        exc->error = FT_THROW( Execution_Too_Long );
    }
  }